

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

PPrototype * __thiscall FxExpression::ReturnProto(FxExpression *this)

{
  PPrototype *pPVar1;
  TArray<PType_*,_PType_*> ret;
  TArray<PType_*,_PType_*> none;
  TArray<PType_*,_PType_*> local_38;
  TArray<PType_*,_PType_*> local_28;
  
  if (this->ValueType != (PType *)0x0) {
    local_38.Most = 0;
    local_38.Count = 0;
    local_38.Array =
         (PType **)
         M_Malloc_Dbg(0,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                      ,0x91);
    local_28.Most = 0;
    local_28.Count = 0;
    local_28.Array =
         (PType **)
         M_Malloc_Dbg(0,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                      ,0x91);
    if (this->ValueType != &TypeVoid->super_PType) {
      TArray<PType_*,_PType_*>::Grow(&local_38,1);
      local_38.Array[local_38.Count] = this->ValueType;
      local_38.Count = local_38.Count + 1;
    }
    pPVar1 = NewPrototype(&local_38,&local_28);
    TArray<PType_*,_PType_*>::~TArray(&local_28);
    TArray<PType_*,_PType_*>::~TArray(&local_38);
    return pPVar1;
  }
  __assert_fail("ValueType != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x11b,"virtual PPrototype *FxExpression::ReturnProto()");
}

Assistant:

PPrototype *FxExpression::ReturnProto()
{
	assert(ValueType != nullptr);

	TArray<PType *> ret(0);
	TArray<PType *> none(0);
	if (ValueType != TypeVoid)
	{
		ret.Push(ValueType);
	}

	return NewPrototype(ret, none);
}